

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::RandSequenceStatementSyntax::setChild
          (RandSequenceStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  size_type sVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  SyntaxList<slang::syntax::ProductionSyntax> *pSVar9;
  NamedLabelSyntax *pNVar10;
  logic_error *this_00;
  long *plVar11;
  size_type *psVar12;
  long *plVar13;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (7 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar11 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar11;
    psVar12 = (size_type *)(plVar11 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar12) {
      local_b0.field_2._M_allocated_capacity = *psVar12;
      local_b0.field_2._8_8_ = plVar11[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar12;
    }
    local_b0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x2add);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_90 == plVar13) {
      local_80 = *plVar13;
      lStack_78 = plVar11[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar13;
    }
    local_88 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar11;
    plVar13 = plVar11 + 2;
    if (local_f0 == plVar13) {
      local_e0 = *plVar13;
      lStack_d8 = plVar11[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar13;
    }
    local_e8 = plVar11[1];
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar8 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar10 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar10 = (NamedLabelSyntax *)*ppSVar8;
      if ((pNVar10->super_SyntaxNode).kind != NamedLabel) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,"T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedLabelSyntax]")
        ;
      }
    }
    (this->super_StatementSyntax).label = pNVar10;
    break;
  case 1:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar7 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar8);
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar7->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar7->super_SyntaxListBase).childCount;
    sVar2 = (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar7->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_StatementSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar2;
    break;
  case 2:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->randsequence).kind = pvVar6->kind;
    (this->randsequence).field_0x2 = uVar3;
    (this->randsequence).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->randsequence).rawLen = uVar5;
    (this->randsequence).info = pIVar1;
    break;
  case 3:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->openParen).kind = pvVar6->kind;
    (this->openParen).field_0x2 = uVar3;
    (this->openParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->openParen).rawLen = uVar5;
    (this->openParen).info = pIVar1;
    break;
  case 4:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->firstProduction).kind = pvVar6->kind;
    (this->firstProduction).field_0x2 = uVar3;
    (this->firstProduction).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->firstProduction).rawLen = uVar5;
    (this->firstProduction).info = pIVar1;
    break;
  case 5:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->closeParen).kind = pvVar6->kind;
    (this->closeParen).field_0x2 = uVar3;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->closeParen).rawLen = uVar5;
    (this->closeParen).info = pIVar1;
    break;
  case 6:
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar9 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::ProductionSyntax>>(*ppSVar8);
    (this->productions).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar9->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->productions).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar9->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->productions).super_SyntaxListBase.childCount = (pSVar9->super_SyntaxListBase).childCount;
    sVar2 = (pSVar9->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>).size_;
    (this->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.data_
         = (pSVar9->super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>).data_;
    (this->productions).super_span<slang::syntax::ProductionSyntax_*,_18446744073709551615UL>.size_
         = sVar2;
    break;
  case 7:
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar6->field_0x2;
    NVar4.raw = (pvVar6->numFlags).raw;
    uVar5 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->endsequence).kind = pvVar6->kind;
    (this->endsequence).field_0x2 = uVar3;
    (this->endsequence).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->endsequence).rawLen = uVar5;
    (this->endsequence).info = pIVar1;
  }
  return;
}

Assistant:

void RandSequenceStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: randsequence = child.token(); return;
        case 3: openParen = child.token(); return;
        case 4: firstProduction = child.token(); return;
        case 5: closeParen = child.token(); return;
        case 6: productions = child.node()->as<SyntaxList<ProductionSyntax>>(); return;
        case 7: endsequence = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}